

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall cppcms::xss::uri_parser::port(uri_parser *this)

{
  long in_RDI;
  undefined1 local_11;
  
  while( true ) {
    local_11 = false;
    if (*(long *)(in_RDI + 0x10) != *(long *)(in_RDI + 0x18)) {
      local_11 = is_digit(**(char **)(in_RDI + 0x10));
    }
    if (local_11 == false) break;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  }
  return true;
}

Assistant:

bool port()
		{
			while((begin_!=end_) && is_digit(*begin_))
				begin_++;
			return true;
		}